

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_post.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int ret;
  char **argv_local;
  int argc_local;
  
  iVar1 = test_post();
  if (iVar1 == 0) {
    return 0;
  }
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_post.c"
                ,0x9f,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {

	int ret = 0;
#if !defined(NHR_NO_POST) && !defined(NHR_APPVEYOR_CI)
	ret += test_post();
	assert(ret == 0);
#endif

	return ret;
}